

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpcbuilder.cpp
# Opt level: O1

void __thiscall DPCResult::build(DPCResult *this,string *source,string *pathOut)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  dirent *pdVar4;
  size_t sVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  runtime_error *prVar9;
  size_type *psVar10;
  DPCResult *pDVar11;
  string childPath;
  string local_120;
  DPCResult *local_100;
  DIR *local_f8;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [16];
  undefined1 local_70 [32];
  string local_50;
  
  pcVar1 = (source->_M_dataplus)._M_p;
  local_100 = this;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + source->_M_string_length);
  bVar2 = isADirectory(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (bVar2) {
    pDVar11 = (DPCResult *)(pathOut->_M_dataplus)._M_p;
    __stream = fopen((char *)pDVar11,"wb");
    if (__stream != (FILE *)0x0) {
      writeDPCMagic(pDVar11,(FILE *)__stream);
      writeHeader(local_100,(FILE *)__stream);
      local_f8 = opendir((source->_M_dataplus)._M_p);
      pdVar4 = readdir(local_f8);
      if (pdVar4 != (dirent *)0x0) {
        do {
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          sVar5 = strlen(pdVar4->d_name);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,pdVar4->d_name,pdVar4->d_name + sVar5);
          iVar3 = std::__cxx11::string::compare((char *)&local_120);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)&local_120);
            if (iVar3 != 0) {
              lVar6 = ftell(__stream);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              pcVar1 = (source->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d0,pcVar1,pcVar1 + source->_M_string_length);
              trailFolder((string *)local_b0,&local_d0);
              pDVar11 = (DPCResult *)local_b0;
              plVar7 = (long *)std::__cxx11::string::_M_append
                                         ((char *)local_b0,(ulong)local_120._M_dataplus._M_p);
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_f0.field_2._M_allocated_capacity = *psVar10;
                local_f0.field_2._8_8_ = plVar7[3];
              }
              else {
                local_f0.field_2._M_allocated_capacity = *psVar10;
                local_f0._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_f0._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              writeFolder(pDVar11,(FILE *)__stream,&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
                operator_delete((void *)local_b0._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              lVar8 = ftell(__stream);
              iVar3 = ((int)lVar6 - (int)lVar8) + local_100->m_blockSize;
              if (0 < iVar3) {
                do {
                  fputc(-0x33,__stream);
                  iVar3 = iVar3 + -1;
                } while (iVar3 != 0);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
          pdVar4 = readdir(local_f8);
        } while (pdVar4 != (dirent *)0x0);
      }
      closedir(local_f8);
      fclose(__stream);
      return;
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_90._M_allocated_capacity = (size_type)(local_b0 + 0x30);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_b0 + 0x20),"Couldn\'t open %s for writing!\n","");
    formatString<char_const*>(&local_120,(string *)(local_b0 + 0x20),(pathOut->_M_dataplus)._M_p);
    std::runtime_error::runtime_error(prVar9,(string *)&local_120);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"%s is not a directory!\n","");
  formatString<char_const*>(&local_120,(string *)local_70,(source->_M_dataplus)._M_p);
  std::runtime_error::runtime_error(prVar9,(string *)&local_120);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DPCResult::build(std::string source, std::string pathOut){
    if(!isADirectory(source))
        throw NOT_A_DIR(source.c_str());
    FILE *file = fopen(pathOut.c_str(),"wb");
    if(file == nullptr)
        throw CANT_WRITE(pathOut.c_str());
    writeDPCMagic(file);
    writeHeader(file);

    DIR *dir = nullptr;
    struct dirent *entry = nullptr;
    dir = opendir(source.c_str());
    while( (entry=readdir(dir))){
        std::string childPath = entry->d_name;
        if (childPath=="." || childPath == "..")
            continue;
        uint32_t pre = ftell(file);
        writeFolder(file,trailFolder(source)+childPath);
        uint32_t post = ftell(file);
        writePadding(file, m_blockSize-(post-pre));
    }
    closedir(dir);
    fclose(file);
}